

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

BlockEntry * __thiscall mkvparser::Cluster::GetEntry(Cluster *this,CuePoint *cp,TrackPosition *tp)

{
  long lVar1;
  BlockEntry *pBVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  longlong lVar5;
  Block *this_00;
  Track *pTVar6;
  long lVar7;
  long len;
  longlong pos;
  long local_40;
  longlong local_38;
  undefined4 extraout_var_00;
  
  lVar1 = cp->m_timecode;
  lVar7 = tp->m_block;
  if (0 < lVar7) {
    while (this->m_entries_count < lVar7) {
      lVar4 = Parse(this,&local_38,&local_40);
      if (lVar4 < 0) {
        return (BlockEntry *)0x0;
      }
      if (lVar4 != 0) {
        return (BlockEntry *)0x0;
      }
    }
    pBVar2 = this->m_entries[lVar7 + -1];
    iVar3 = (*pBVar2->_vptr_BlockEntry[2])(pBVar2);
    if ((((Block *)CONCAT44(extraout_var,iVar3))->m_track == tp->m_track) &&
       (lVar5 = Block::GetTimeCode((Block *)CONCAT44(extraout_var,iVar3),this), lVar5 == lVar1)) {
      return pBVar2;
    }
  }
  lVar7 = 0;
  while( true ) {
    if (this->m_entries_count <= lVar7) {
      lVar4 = Parse(this,&local_38,&local_40);
      if (lVar4 < 0) {
        return (BlockEntry *)0x0;
      }
      if (lVar4 != 0) {
        return (BlockEntry *)0x0;
      }
    }
    pBVar2 = this->m_entries[lVar7];
    iVar3 = (*pBVar2->_vptr_BlockEntry[2])(pBVar2);
    this_00 = (Block *)CONCAT44(extraout_var_00,iVar3);
    if ((this_00->m_track == tp->m_track) &&
       (lVar5 = Block::GetTimeCode(this_00,this), lVar1 <= lVar5)) break;
    lVar7 = lVar7 + 1;
  }
  if ((lVar5 <= lVar1) &&
     (pTVar6 = Tracks::GetTrackByNumber(this->m_pSegment->m_pTracks,tp->m_track),
     pTVar6 != (Track *)0x0)) {
    lVar1 = (pTVar6->m_info).type;
    if (lVar1 == 1) {
      if (-1 < (char)this_00->m_flags) {
        return (BlockEntry *)0x0;
      }
      return pBVar2;
    }
    if (lVar1 == 2) {
      return pBVar2;
    }
  }
  return (BlockEntry *)0x0;
}

Assistant:

const BlockEntry* Cluster::GetEntry(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) const {
  assert(m_pSegment);
  const long long tc = cp.GetTimeCode();

  if (tp.m_block > 0) {
    const long block = static_cast<long>(tp.m_block);
    const long index = block - 1;

    while (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if ((pBlock->GetTrackNumber() == tp.m_track) &&
        (pBlock->GetTimeCode(this) == tc)) {
      return pEntry;
    }
  }

  long index = 0;

  for (;;) {
    if (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;

      assert(m_entries);
      assert(index < m_entries_count);
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if (pBlock->GetTrackNumber() != tp.m_track) {
      ++index;
      continue;
    }

    const long long tc_ = pBlock->GetTimeCode(this);

    if (tc_ < tc) {
      ++index;
      continue;
    }

    if (tc_ > tc)
      return NULL;

    const Tracks* const pTracks = m_pSegment->GetTracks();
    assert(pTracks);

    const long tn = static_cast<long>(tp.m_track);
    const Track* const pTrack = pTracks->GetTrackByNumber(tn);

    if (pTrack == NULL)
      return NULL;

    const long long type = pTrack->GetType();

    if (type == 2)  // audio
      return pEntry;

    if (type != 1)  // not video
      return NULL;

    if (!pBlock->IsKey())
      return NULL;

    return pEntry;
  }
}